

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O1

void __thiscall cppcms::plugin::signature_error::signature_error(signature_error *this,string *msg)

{
  pointer pcVar1;
  
  *(code **)&this->super_bad_cast = std::_V2::error_category::default_error_condition;
  booster::backtrace::backtrace(&(this->super_bad_cast).super_backtrace,0x20);
  *(undefined ***)&this->super_bad_cast = &PTR__signature_error_0028d128;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__signature_error_0028d150;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg_,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

signature_error::signature_error(std::string const &msg) : msg_(msg) {}